

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void clusterRemoval(Mat *image,int threshold)

{
  _Rb_tree_header *p_Var1;
  int x;
  long lVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int y;
  long lVar5;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> cluster;
  Mat out;
  Mat temp;
  _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
  local_180;
  Mat local_150 [8];
  int local_148;
  int local_144;
  long local_140;
  long *local_108;
  Mat local_f0 [8];
  int local_e8;
  int local_e4;
  long local_e0;
  long *local_a8;
  Mat local_90 [96];
  
  cv::Mat::clone();
  cv::Mat::Mat(local_150,*(int *)(image + 8),*(int *)(image + 0xc),*(uint *)image & 0xfff);
  for (lVar2 = 0; lVar2 < local_144; lVar2 = lVar2 + 1) {
    for (lVar5 = 0; lVar5 < local_148; lVar5 = lVar5 + 1) {
      *(undefined1 *)(lVar2 + *local_108 * lVar5 + local_140) = 0;
    }
  }
  p_Var1 = &local_180._M_impl.super__Rb_tree_header;
  for (lVar2 = 0; lVar2 < local_e4; lVar2 = lVar2 + 1) {
    for (lVar5 = 0; lVar5 < local_e8; lVar5 = lVar5 + 1) {
      if (*(char *)(lVar2 + *local_a8 * lVar5 + local_e0) == -1) {
        cv::Mat::Mat(local_90,local_f0);
        findCluster((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)&local_180,local_90,
                    (int)lVar2,(int)lVar5);
        cv::Mat::~Mat(local_90);
        p_Var3 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var4 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((ulong)(long)threshold < local_180._M_impl.super__Rb_tree_header._M_node_count) {
          for (; p_Var4 = local_180._M_impl.super__Rb_tree_header._M_header._M_left,
              (_Rb_tree_header *)p_Var3 != p_Var1;
              p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
            *(undefined1 *)
             ((long)(int)p_Var3[1]._M_color +
             (long)*(int *)&p_Var3[1].field_0x4 * *local_108 + local_140) = 0xff;
          }
        }
        for (; (_Rb_tree_header *)p_Var4 != p_Var1;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          *(undefined1 *)
           ((long)(int)p_Var4[1]._M_color +
           (long)*(int *)&p_Var4[1].field_0x4 * *local_a8 + local_e0) = 0;
        }
        std::
        _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
        ::~_Rb_tree(&local_180);
      }
    }
  }
  cv::Mat::operator=(image,local_150);
  cv::Mat::~Mat(local_150);
  cv::Mat::~Mat(local_f0);
  return;
}

Assistant:

void clusterRemoval(cv::Mat & image, int threshold) {
	cv::Mat temp = image.clone();
	cv::Mat out = cv::Mat(image.rows, image.cols, image.type());
	for (int x = 0; x < out.cols; x++)
		for (int y = 0; y < out.rows; y++)
			out.at<uchar>(cv::Point(x, y)) = 0;
	for (int x = 0; x < temp.cols; x++) {
		for (int y = 0; y < temp.rows; y++) {
			if (temp.at<uchar>(cv::Point(x, y)) == UCHAR_MAX) {
				std::set<mPoint> cluster = findCluster(temp, x, y);
				if (cluster.size() > threshold) {
					for (auto point : cluster) {
						out.at<uchar>(point) = UCHAR_MAX;
					}
				}
				for (auto point : cluster) {
					temp.at<uchar>(point) = 0;
				}
			}
		}
	}
	image = out;
}